

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_amount.cpp
# Opt level: O0

Amount cfd::core::operator+(int64_t satoshi_amount,Amount *amount)

{
  int64_t satoshi_amount_00;
  Amount AVar1;
  Amount local_38;
  Amount *local_28;
  Amount *amount_local;
  int64_t satoshi_amount_local;
  
  local_28 = amount;
  amount_local = (Amount *)satoshi_amount;
  satoshi_amount_00 = Amount::GetSatoshiValue(amount);
  AVar1 = Amount::CreateBySatoshiAmount(satoshi_amount_00);
  local_38.amount_ = AVar1.amount_;
  local_38.ignore_check_ = AVar1.ignore_check_;
  AVar1 = Amount::operator+=(&local_38,satoshi_amount);
  return AVar1;
}

Assistant:

Amount operator+(const int64_t satoshi_amount, const Amount& amount) {
  return Amount::CreateBySatoshiAmount(amount.GetSatoshiValue()) +=
         satoshi_amount;
}